

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall
tf::Executor::_schedule<tf::Node**>(Executor *this,Worker *worker,Node **first,Node **last)

{
  NonblockingNotifierV2 *pNVar1;
  size_type sVar2;
  long in_RCX;
  anon_class_16_2_3fe397bd *in_RDX;
  ulong __n;
  Node *in_RSI;
  BoundedTaskQueue<tf::Node_*,_8UL> *in_RDI;
  size_t i_1;
  Node *node;
  size_t i;
  size_t num_nodes;
  scoped_lock<std::mutex> lock;
  unsigned_long b;
  Executor *__m;
  vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
  *this_00;
  NonblockingNotifierV2 *this_01;
  NonblockingNotifierV2 *local_70;
  BoundedTaskQueue<tf::Node_*,_8UL> *this_02;
  
  pNVar1 = (NonblockingNotifierV2 *)(in_RCX - (long)in_RDX >> 3);
  if (pNVar1 != (NonblockingNotifierV2 *)0x0) {
    if ((BoundedTaskQueue<tf::Node_*,_8UL> *)(in_RSI->_name).field_2._M_allocated_capacity == in_RDI
       ) {
      for (local_70 = (NonblockingNotifierV2 *)0x0; local_70 < pNVar1;
          local_70 = (NonblockingNotifierV2 *)
                     ((long)&(local_70->_state).super___atomic_base<unsigned_long>._M_i + 1)) {
        BoundedTaskQueue<tf::Node*,8ul>::
        push<tf::Node*&,tf::Executor::_schedule<tf::Node**>(tf::Worker&,tf::Node**,tf::Node**)::_lambda()_1_>
                  (in_RDI,(Node **)in_RSI,in_RDX);
        NonblockingNotifierV2::notify_one((NonblockingNotifierV2 *)0x10ce57);
      }
    }
    else {
      this_02 = in_RDI;
      for (this_01 = (NonblockingNotifierV2 *)0x0; this_01 < pNVar1;
          this_01 = (NonblockingNotifierV2 *)
                    ((long)&(this_01->_state).super___atomic_base<unsigned_long>._M_i + 1)) {
        this_00 = (vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                   *)&in_RDI->field_0xd8;
        __m = (&in_RDX->this)[(long)this_01];
        sVar2 = std::
                vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                ::size(this_00);
        __n = (ulong)__m % sVar2;
        std::
        vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
        ::operator[](this_00,__n);
        std::scoped_lock<std::mutex>::scoped_lock
                  ((scoped_lock<std::mutex> *)this_00,&__m->_taskflows_mutex);
        std::
        vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
        ::operator[](this_00,__n);
        UnboundedTaskQueue<tf::Node_*>::push((UnboundedTaskQueue<tf::Node_*> *)this_02,in_RSI);
        std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x10cf6a);
      }
      NonblockingNotifierV2::notify_n(this_01,(size_t)in_RDI);
    }
  }
  return;
}

Assistant:

void Executor::_schedule(Worker& worker, I first, I last) {

  size_t num_nodes = last - first;
  
  if(num_nodes == 0) {
    return;
  }
  
  // NOTE: We cannot use first/last in the for-loop (e.g., for(; first != last; ++first)).
  // This is because when a node v is inserted into the queue, v can run and finish 
  // immediately. If v is the last node in the graph, it will tear down the parent task vector
  // which cause the last ++first to fail. This problem is specific to MSVC which has a stricter
  // iterator implementation in std::vector than GCC/Clang.
  if(worker._executor == this) {
    for(size_t i=0; i<num_nodes; i++) {
      auto node = detail::get_node_ptr(first[i]);
      worker._wsq.push(node, [&](){ _buffers.push(node); });
      _notifier.notify_one();
    }
    return;
  }
  
  for(size_t i=0; i<num_nodes; i++) {
    _buffers.push(detail::get_node_ptr(first[i]));
  }
  _notifier.notify_n(num_nodes);
}